

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

size_t __thiscall kws::Parser::FindEndOfClass(Parser *this,size_t position)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  ulong in_RSI;
  long in_RDI;
  bool in_stack_00000017;
  size_t in_stack_00000018;
  size_t i_1;
  size_t classPos;
  size_t openingChar;
  size_t i;
  bool isClass;
  size_t endclass;
  ulong local_48;
  ulong local_40;
  ulong local_30;
  size_t local_20;
  ulong local_18;
  
  local_18 = in_RSI;
  if (in_RSI == 0xffffffffffffffff) {
    local_18 = 0;
  }
  local_20 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1dce50);
  do {
    if (local_20 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    bVar1 = true;
    local_30 = local_20;
    do {
      local_30 = local_30 + 1;
      uVar2 = std::__cxx11::string::size();
      if (uVar2 <= local_30) break;
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
      if ((((*pcVar3 != ' ') &&
           (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar3 != '\r')) &&
          (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar3 != '\n')) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar3 != ';')) {
        bVar1 = false;
        break;
      }
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
    } while (*pcVar3 != ';');
    if (bVar1) {
      sVar4 = FindOpeningChar((Parser *)classPos,i_1._7_1_,i_1._6_1_,in_stack_00000018,
                              in_stack_00000017);
      local_40 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e60e6);
      while (local_40 != 0xffffffffffffffff && local_40 < local_18) {
        if ((local_40 != 0xffffffffffffffff) && (sVar4 != 0xffffffffffffffff)) {
          for (local_48 = local_40; local_48 < sVar4 + 1; local_48 = local_48 + 1) {
            pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
            if (*pcVar3 == '{') {
              local_40 = local_48;
              break;
            }
          }
          if (sVar4 == local_40) {
            return local_20;
          }
        }
        local_40 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e60e6);
      }
    }
    local_20 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1dce50);
  } while( true );
}

Assistant:

size_t Parser::FindEndOfClass(size_t position) const
{
  if(position == std::string::npos)
    {
    position = 0;
    }

  // Try to find the end of the class
  size_t endclass = m_BufferNoComment.find("}",position);
  while(endclass != std::string::npos)
    {
    bool isClass = true;
    // if the next char is not a semicolon this cannot be a class
    for(size_t i=endclass+1;i<m_BufferNoComment.size();i++)
      {
      if( (m_BufferNoComment[i] != ' ') && (m_BufferNoComment[i] != '\r')
        && (m_BufferNoComment[i] != '\n') && (m_BufferNoComment[i] != ';')
        )
        {
        isClass = false;
        break;
        }
      if(m_BufferNoComment[i] == ';')
        {
        break;
        }
      }

    if(isClass)
      {
      size_t openingChar = this->FindOpeningChar('}','{',endclass,true);
      // check if we have the class name somewhere
      size_t classPos = m_BufferNoComment.find("class",0);
      while(classPos != std::string::npos && classPos<position)
        {
        if(classPos != std::string::npos && openingChar!= std::string::npos)
          {
          for(size_t i=classPos;i<openingChar+1;i++)
            {
            if(m_BufferNoComment[i] == '{')
              {
              classPos = i;
              break;
              }
            }
          if(openingChar == classPos)
            {
            return endclass;
            }
          }
        classPos = m_BufferNoComment.find("class",classPos+1);
        }
      }
    endclass = m_BufferNoComment.find("}",endclass+1);
    }
  return std::string::npos;
}